

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O2

void __thiscall
VariableStruct::VariableStruct
          (VariableStruct *this,string *VarName,VARTYPE newType,VARCLASS newClass,int newOutput,
          int newParCount)

{
  (this->BasicName)._M_dataplus._M_p = (pointer)&(this->BasicName).field_2;
  (this->BasicName)._M_string_length = 0;
  (this->BasicName).field_2._M_local_buf[0] = '\0';
  (this->CName)._M_dataplus._M_p = (pointer)&(this->CName).field_2;
  (this->CName)._M_string_length = 0;
  (this->CName).field_2._M_local_buf[0] = '\0';
  (this->Prefix)._M_dataplus._M_p = (pointer)&(this->Prefix).field_2;
  (this->Prefix)._M_string_length = 0;
  (this->Prefix).field_2._M_local_buf[0] = '\0';
  (this->ParList).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ParList).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ParList).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->Type = newType;
  this->Class = newClass;
  this->Output = newOutput;
  this->ParCount = newParCount;
  this->EverUsed = 0;
  std::__cxx11::string::_M_assign((string *)this);
  UpperCase(&this->BasicName);
  this->GlobalFlag = 0;
  if ((this->Type == VARTYPE_DOUBLE) && (0xfffffff5 < (int)*(VarName->_M_dataplus)._M_p - 0x3aU)) {
    __assert_fail("Type != 13 || isdigit(VarName.c_str()[0]) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/khandy21yo[P]btran/src/variable.h"
                  ,0x43,
                  "VariableStruct::VariableStruct(const std::string, VARTYPE, VARCLASS, int, int)");
  }
  this->Original = (Node *)0x0;
  return;
}

Assistant:

VariableStruct(
		const std::string VarName = "",		/**< Basic variable name */
		VARTYPE newType = VARTYPE_NONE,		/**< Type of variable */
		VARCLASS newClass = VARCLASS_NONE,	/**< Variable class */
		int newOutput = false,			/**< Has variable definition been output yet? */
		int newParCount = 0			/**< Parameter count */
	)
	{
		Type = newType;
		Class = newClass;
		Output = newOutput;
		ParCount = newParCount;
		EverUsed = 0;
		BasicName = VarName;
		UpperCase(BasicName);
		GlobalFlag = 0;
	  	assert(Type != 13 || isdigit(VarName.c_str()[0]) == 0);
		Original = 0;
	}